

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor.cpp
# Opt level: O0

void __thiscall Cryptor::show_statistics(Cryptor *this)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  reference pcVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  long lVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double compression;
  size_type diff;
  string local_4c0 [32];
  bitset<8UL> local_4a0;
  char local_491;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_490;
  char i_1;
  iterator __end2_1;
  iterator __begin2_1;
  string *__range2_1;
  stringstream ss2;
  basic_ostream<char,_std::char_traits<char>_> local_448 [376];
  string local_2d0;
  string local_2b0;
  string local_290 [32];
  bitset<8UL> local_270;
  char local_261;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_260;
  char i;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  stringstream ss;
  basic_ostream<char,_std::char_traits<char>_> local_218 [376];
  string local_a0;
  string local_80;
  string local_50 [8];
  string s2;
  string s;
  Cryptor *this_local;
  
  std::__cxx11::string::string((string *)(s2.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_50);
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"input message: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout," ");
  get_in_message_abi_cxx11_(&local_80,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_80);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_80);
  get_in_message_abi_cxx11_(&local_a0,this);
  lVar3 = std::__cxx11::string::find_first_not_of((char *)&local_a0,0x1174c8);
  std::__cxx11::string::~string((string *)&local_a0);
  if (lVar3 != -1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"or binary: ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::stringstream((stringstream *)&__range2);
    get_in_message_abi_cxx11_((string *)&__begin2,this);
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_260._M_current = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffda0);
      if (!bVar1) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      local_261 = *pcVar4;
      std::bitset<8UL>::bitset(&local_270,(long)local_261);
      pbVar5 = std::operator<<(local_218,&local_270);
      std::ostream::operator<<(pbVar5,std::flush<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::~string((string *)&__begin2);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)(s2.field_2._M_local_buf + 8),local_290);
    std::__cxx11::string::~string(local_290);
    poVar2 = std::operator<<((ostream *)&std::cout," ");
    poVar2 = std::operator<<(poVar2,(string *)(s2.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::~stringstream((stringstream *)&__range2);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"output: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout," ");
  get_out_message_abi_cxx11_(&local_2b0,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_2b0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_2b0);
  get_out_message_abi_cxx11_(&local_2d0,this);
  lVar3 = std::__cxx11::string::find_first_not_of((char *)&local_2d0,0x1174c8);
  std::__cxx11::string::~string((string *)&local_2d0);
  if (lVar3 == -1) {
    get_out_message_abi_cxx11_((string *)&diff,this);
    std::__cxx11::string::operator=(local_50,(string *)&diff);
    std::__cxx11::string::~string((string *)&diff);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"or binary: ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::stringstream((stringstream *)&__range2_1);
    get_out_message_abi_cxx11_((string *)&__begin2_1,this);
    __end2_1._M_current = (char *)std::__cxx11::string::begin();
    _Stack_490._M_current = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffb70);
      if (!bVar1) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2_1);
      local_491 = *pcVar4;
      std::bitset<8UL>::bitset(&local_4a0,(long)local_491);
      pbVar5 = std::operator<<(local_448,&local_4a0);
      std::ostream::operator<<(pbVar5,std::flush<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_1);
    }
    std::__cxx11::string::~string((string *)&__begin2_1);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_50,local_4c0);
    std::__cxx11::string::~string(local_4c0);
    poVar2 = std::operator<<((ostream *)&std::cout," ");
    poVar2 = std::operator<<(poVar2,local_50);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::~stringstream((stringstream *)&__range2_1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if ((this->show_ & 1U) != 0) {
    lVar6 = std::__cxx11::string::size();
    lVar3 = std::__cxx11::string::size();
    lVar6 = lVar6 - lVar3;
    auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = 0x45300000;
    uVar7 = std::__cxx11::string::size();
    auVar9._8_4_ = (int)((ulong)uVar7 >> 0x20);
    auVar9._0_8_ = uVar7;
    auVar9._12_4_ = 0x45300000;
    poVar2 = std::operator<<((ostream *)&std::cout,"compression: ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(((auVar8._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) *
                               100.0) / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,(int)uVar7) -
                                        4503599627370496.0)));
    poVar2 = std::operator<<(poVar2,"%");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"---------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(s2.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Cryptor::show_statistics() {
  string s;
  string s2;
  cout << "---------------" << endl;
  cout << "input message: " << endl;
  cout << " " << get_in_message() << endl;
  if (get_in_message().find_first_not_of("01") != string::npos) {
    cout << "or binary: " << endl;
    stringstream ss;
    for (auto i : get_in_message()) {
      ss << bitset<8>(static_cast<unsigned long long int>(i)) << flush;
    }
    s = ss.str();
    cout << " " << s << endl;
  }
  cout << endl;

  cout << "output: " << endl;
  cout << " " << get_out_message() << endl;
  if (get_out_message().find_first_not_of("01") != string::npos) {
    cout << "or binary: " << endl;
    stringstream ss2;
    for (auto i : get_out_message()) {
      ss2 << bitset<8>(static_cast<unsigned long long int>(i)) << flush;
    }
    s2 = ss2.str();
    cout << " " << s2 << endl;
  }
  else {
    s2 = get_out_message();
  }
  cout << "---------------" << endl;

  if (show_) {
    const auto diff = s.size() - s2.size();
    const auto compression = (diff * 100.0) / s.size();
    cout << "compression: " << compression << "%" << endl;
    cout << "---------------" << endl;
  }
}